

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1005.cpp
# Opt level: O2

int main(void)

{
  int i;
  int iVar1;
  int q;
  int local_24;
  
  std::istream::operator>>((istream *)&std::cin,&n);
  for (iVar1 = 0; iVar1 < n; iVar1 = iVar1 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_24);
    std::vector<int,_std::allocator<int>_>::push_back(&a,&local_24);
  }
  f(0,0,0);
  std::ostream::operator<<((ostream *)&std::cout,min_);
  return 0;
}

Assistant:

int main() {
    std::cin >> n;
    for (int i = 0; i < n; ++i) {
        int q;
        std::cin >> q;
        a.push_back(q);
    }
    f(0, 0, 0);
    std::cout << min_;
    return 0;
}